

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesUserRegistry(cmFindPackageCommand *this)

{
  char *pcVar1;
  mapped_type *outPaths;
  allocator local_39;
  undefined1 local_38 [8];
  string dir;
  char *home;
  cmFindPackageCommand *this_local;
  
  pcVar1 = cmsys::SystemTools::GetEnv("HOME");
  if (pcVar1 != (char *)0x0) {
    dir.field_2._8_8_ = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::__cxx11::string::operator+=((string *)local_38,"/.cmake/packages/");
    std::__cxx11::string::operator+=((string *)local_38,(string *)&this->Name);
    outPaths = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                            &PathLabel::UserRegistry.super_PathLabel);
    LoadPackageRegistryDir(this,(string *)local_38,outPaths);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesUserRegistry()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinUser();
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) ==
      B_OK)
    {
    std::string fname = dir;
    fname += "/cmake/packages/";
    fname += Name;
    this->LoadPackageRegistryDir(fname,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
    }
#else
  if(const char* home = cmSystemTools::GetEnv("HOME"))
    {
    std::string dir = home;
    dir += "/.cmake/packages/";
    dir += this->Name;
    this->LoadPackageRegistryDir(dir,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
    }
#endif
}